

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::UninterpretedOption_NamePart::ByteSizeLong(UninterpretedOption_NamePart *this)

{
  uint32_t *puVar1;
  string *value;
  size_t sVar2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  UninterpretedOption_NamePart *this_local;
  
  puVar1 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  if ((*puVar1 & 3) == 3) {
    value = _internal_name_part_abi_cxx11_(this);
    sStack_18 = internal::WireFormatLite::StringSize(value);
    sStack_18 = sStack_18 + 3;
  }
  else {
    sStack_18 = RequiredFieldsByteSizeFallback(this);
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_18,&this->_cached_size_);
  return sVar2;
}

Assistant:

size_t UninterpretedOption_NamePart::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption.NamePart)
  size_t total_size = 0;

  if (((_has_bits_[0] & 0x00000003) ^ 0x00000003) == 0) {  // All required fields are present.
    // required string name_part = 1;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name_part());

    // required bool is_extension = 2;
    total_size += 1 + 1;

  } else {
    total_size += RequiredFieldsByteSizeFallback();
  }
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}